

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_table_clear(jit_State *J,RecordFFData *rd)

{
  if ((*J->base & 0x1f000000) == 0xb000000) {
    rd->nres = 0;
    lj_ir_call(J,IRCALL_lj_tab_clear);
    J->needsnap = '\x01';
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_clear(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    rd->nres = 0;
    lj_ir_call(J, IRCALL_lj_tab_clear, tr);
    J->needsnap = 1;
  }  /* else: Interpreter will throw. */
}